

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_page_operator.c
# Opt level: O0

HPDF_STATUS
HPDF_Page_SetTextMatrix
          (HPDF_Page page,HPDF_REAL a,HPDF_REAL b,HPDF_REAL c,HPDF_REAL d,HPDF_REAL x,HPDF_REAL y)

{
  void *pvVar1;
  char *eptr_00;
  char *pcVar2;
  HPDF_STATUS HVar3;
  HPDF_PageAttr attr;
  char *eptr;
  char *pbuf;
  char buf [512];
  HPDF_STATUS ret;
  HPDF_REAL y_local;
  HPDF_REAL x_local;
  HPDF_REAL d_local;
  HPDF_REAL c_local;
  HPDF_REAL b_local;
  HPDF_REAL a_local;
  HPDF_Page page_local;
  
  buf._504_8_ = HPDF_Page_CheckState(page,4);
  eptr_00 = buf + 0x1f7;
  page_local = (HPDF_Page)buf._504_8_;
  if ((HPDF_Page)buf._504_8_ == (HPDF_Page)0x0) {
    pvVar1 = page->attr;
    if ((((a != 0.0) || (NAN(a))) && ((d != 0.0 || (NAN(d))))) ||
       (((b != 0.0 || (NAN(b))) && ((c != 0.0 || (NAN(c))))))) {
      HPDF_MemSet(&pbuf,'\0',0x200);
      pcVar2 = HPDF_FToA((char *)&pbuf,a,eptr_00);
      *pcVar2 = ' ';
      pcVar2 = HPDF_FToA(pcVar2 + 1,b,eptr_00);
      *pcVar2 = ' ';
      pcVar2 = HPDF_FToA(pcVar2 + 1,c,eptr_00);
      *pcVar2 = ' ';
      pcVar2 = HPDF_FToA(pcVar2 + 1,d,eptr_00);
      *pcVar2 = ' ';
      pcVar2 = HPDF_FToA(pcVar2 + 1,x,eptr_00);
      *pcVar2 = ' ';
      pcVar2 = HPDF_FToA(pcVar2 + 1,y,eptr_00);
      HPDF_StrCpy(pcVar2," Tm\n",eptr_00);
      HVar3 = HPDF_Stream_WriteStr(*(HPDF_Stream *)((long)pvVar1 + 0x70),(char *)&pbuf);
      if (HVar3 == 0) {
        *(HPDF_REAL *)((long)pvVar1 + 0x48) = a;
        *(HPDF_REAL *)((long)pvVar1 + 0x4c) = b;
        *(HPDF_REAL *)((long)pvVar1 + 0x50) = c;
        *(HPDF_REAL *)((long)pvVar1 + 0x54) = d;
        *(HPDF_REAL *)((long)pvVar1 + 0x58) = x;
        *(HPDF_REAL *)((long)pvVar1 + 0x5c) = y;
        *(undefined4 *)((long)pvVar1 + 0x40) = *(undefined4 *)((long)pvVar1 + 0x58);
        *(undefined4 *)((long)pvVar1 + 0x44) = *(undefined4 *)((long)pvVar1 + 0x5c);
        page_local = (HPDF_Page)buf._504_8_;
      }
      else {
        page_local = (HPDF_Page)HPDF_CheckError(page->error);
      }
    }
    else {
      page_local = (HPDF_Page)HPDF_RaiseError(page->error,0x1039,0);
    }
  }
  return (HPDF_STATUS)page_local;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_Page_SetTextMatrix  (HPDF_Page         page,
                          HPDF_REAL    a,
                          HPDF_REAL    b,
                          HPDF_REAL    c,
                          HPDF_REAL    d,
                          HPDF_REAL    x,
                          HPDF_REAL    y)
{
    HPDF_STATUS ret = HPDF_Page_CheckState (page, HPDF_GMODE_TEXT_OBJECT);
    char buf[HPDF_TMP_BUF_SIZ];
    char *pbuf = buf;
    char *eptr = buf + HPDF_TMP_BUF_SIZ - 1;
    HPDF_PageAttr attr;

    HPDF_PTRACE ((" HPDF_Page_SetTextMatrix\n"));

    if (ret != HPDF_OK)
        return ret;

    attr = (HPDF_PageAttr)page->attr;

    if ((a == 0 || d == 0) && (b == 0 || c == 0))
        return HPDF_RaiseError (page->error, HPDF_INVALID_PARAMETER, 0);

    HPDF_MemSet (buf, 0, HPDF_TMP_BUF_SIZ);

    pbuf = HPDF_FToA (pbuf, a, eptr);
    *pbuf++ = ' ';
    pbuf = HPDF_FToA (pbuf, b, eptr);
    *pbuf++ = ' ';
    pbuf = HPDF_FToA (pbuf, c, eptr);
    *pbuf++ = ' ';
    pbuf = HPDF_FToA (pbuf, d, eptr);
    *pbuf++ = ' ';
    pbuf = HPDF_FToA (pbuf, x, eptr);
    *pbuf++ = ' ';
    pbuf = HPDF_FToA (pbuf, y, eptr);
    HPDF_StrCpy (pbuf, " Tm\012", eptr);

    if (HPDF_Stream_WriteStr (attr->stream, buf) != HPDF_OK)
        return HPDF_CheckError (page->error);

    attr->text_matrix.a = a;
    attr->text_matrix.b = b;
    attr->text_matrix.c = c;
    attr->text_matrix.d = d;
    attr->text_matrix.x = x;
    attr->text_matrix.y = y;
    attr->text_pos.x = attr->text_matrix.x;
    attr->text_pos.y = attr->text_matrix.y;

    return ret;
}